

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get<std::array<float,4ul>>
          (Attribute *this,double t,array<float,_4UL> *dst,TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  optional<std::array<float,_4UL>_> local_4c [2];
  
  if (dst != (array<float,_4UL> *)0x0) {
    if (((NAN(t)) &&
        ((((this->_var)._blocked != false ||
          (pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0)) ||
         ((uVar2 = (*pvVar1->type_id)(), uVar2 != 0 &&
          ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
           (uVar2 = (*pvVar1->type_id)(), uVar2 != 1)))))))) &&
       (primvar::PrimVar::get_value<std::array<float,4ul>>(local_4c,&this->_var),
       local_4c[0].has_value_ != false)) {
      *(undefined8 *)dst->_M_elems = local_4c[0].contained._0_8_;
      *(undefined8 *)(dst->_M_elems + 2) = local_4c[0].contained._8_8_;
      local_4c[0].has_value_ = true;
    }
    else if ((this->_var)._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (this->_var)._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start) {
      primvar::PrimVar::get_value<std::array<float,4ul>>(local_4c,&this->_var);
      if (local_4c[0].has_value_ != false) {
        *(undefined8 *)dst->_M_elems = local_4c[0].contained._0_8_;
        *(undefined8 *)(dst->_M_elems + 2) = local_4c[0].contained._8_8_;
      }
    }
    else {
      local_4c[0].has_value_ =
           primvar::PrimVar::get_interpolated_value<std::array<float,4ul>>
                     (&this->_var,t,tinterp,dst);
    }
    return local_4c[0].has_value_;
  }
  return false;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }